

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O1

void __thiscall
pbrt::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,CameraBaseParameters *baseParameters,Float fov,
          Bounds2f *screenWindow,Float lensRadius,Float focalDistance)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  Float FVar9;
  Float FVar10;
  Float FVar11;
  Float FVar12;
  Float FVar13;
  Float FVar14;
  Float FVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  uintptr_t iptr;
  undefined1 uVar28;
  byte bVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float y;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auStack_428 [8];
  Float local_420;
  Float local_41c;
  Float local_418;
  CameraHandle local_400;
  Transform local_3f8;
  CameraBaseParameters local_378;
  
  auVar33 = in_ZMM26._0_16_;
  bVar29 = &stack0x00000000 == (undefined1 *)0x428;
  uVar28 = (POPCOUNT((ulong)auStack_428 & 0xff) & 1U) == 0;
  local_420 = fov;
  local_41c = lensRadius;
  local_418 = focalDistance;
  memcpy(&local_378,baseParameters,0x340);
  local_378.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_378.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  Perspective(&local_3f8,local_420,0.01,1000.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,&local_378,&local_3f8,screenWindow,local_41c,local_418);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  FVar1 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0];
  FVar2 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1];
  auVar31 = vxorps_avx512vl(auVar33,auVar33);
  auVar32 = vmulss_avx512f(ZEXT416((uint)FVar2),auVar31);
  auVar33 = vaddss_avx512f(ZEXT416((uint)FVar1),auVar32);
  FVar3 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2];
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar3),auVar31);
  FVar4 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  auVar34 = vaddss_avx512f(ZEXT416((uint)FVar4),auVar33);
  FVar5 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0];
  FVar6 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1];
  auVar35 = vmulss_avx512f(ZEXT416((uint)FVar6),auVar31);
  auVar33 = vaddss_avx512f(ZEXT416((uint)FVar5),auVar35);
  FVar7 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2];
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar7),auVar31);
  FVar8 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  auVar36 = vaddss_avx512f(ZEXT416((uint)FVar8),auVar33);
  FVar9 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0];
  FVar10 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1];
  auVar37 = vmulss_avx512f(ZEXT416((uint)FVar10),auVar31);
  auVar33 = vaddss_avx512f(ZEXT416((uint)FVar9),auVar37);
  FVar11 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2];
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar11),auVar31);
  fVar30 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar38 = vaddss_avx512f(ZEXT416((uint)fVar30),auVar33);
  FVar12 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0];
  FVar13 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1];
  auVar39 = vmulss_avx512f(ZEXT416((uint)FVar13),auVar31);
  auVar33 = vaddss_avx512f(ZEXT416((uint)FVar12),auVar39);
  FVar14 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2];
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar14),auVar31);
  FVar15 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  vaddss_avx512f(ZEXT416((uint)FVar15),auVar33);
  auVar33 = vucomiss_avx512f(ZEXT416(0x3f800000));
  bVar26 = (bool)(bVar29 & !(bool)uVar28);
  auVar40 = vdivss_avx512f(auVar34,auVar33);
  auVar41 = vdivss_avx512f(auVar36,auVar33);
  auVar42 = vdivss_avx512f(auVar38,auVar33);
  auVar40._0_4_ = (uint)bVar26 * auVar34._0_4_ + (uint)!bVar26 * auVar40._0_4_;
  auVar34._4_12_ = auVar41._4_12_;
  auVar34._0_4_ = (uint)bVar26 * auVar36._0_4_ + (uint)!bVar26 * auVar41._0_4_;
  auVar33 = vinsertps_avx512f(auVar40,auVar34,0x10);
  auVar36._4_12_ = auVar42._4_12_;
  auVar36._0_4_ = (uint)bVar26 * auVar38._0_4_ + (uint)!bVar26 * auVar42._0_4_;
  auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)FVar1),auVar31);
  auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)FVar3),auVar31);
  auVar34 = vaddss_avx512f(ZEXT416((uint)FVar4),auVar32);
  auVar32 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)FVar5),auVar31);
  auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)FVar7),auVar31);
  auVar35 = vaddss_avx512f(ZEXT416((uint)FVar8),auVar32);
  auVar32 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)FVar9),auVar31);
  auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)FVar11),auVar31);
  auVar37 = vaddss_avx512f(ZEXT416((uint)fVar30),auVar32);
  auVar32 = vfmadd231ss_avx512f(auVar39,ZEXT416((uint)FVar12),auVar31);
  auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)FVar14),auVar31);
  vaddss_avx512f(ZEXT416((uint)FVar15),auVar32);
  auVar32 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar34 = vdivss_avx512f(auVar34,auVar32);
  auVar35 = vdivss_avx512f(auVar35,auVar32);
  auVar38 = vdivss_avx512f(auVar37,auVar32);
  auVar32 = vinsertps_avx512f(auVar34,auVar35,0x10);
  auVar33 = vsubps_avx512vl(auVar33,auVar32);
  auVar35 = vsubss_avx512f(auVar36,auVar38);
  uVar20 = vmovlps_avx512f(auVar33);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar20;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar35._0_4_;
  auVar33 = vxorps_avx512vl(auVar33,auVar33);
  auVar33 = vfmadd213ss_avx512f(auVar33,ZEXT416((uint)FVar1),ZEXT416((uint)FVar2));
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar3),auVar31);
  auVar36 = vaddss_avx512f(ZEXT416((uint)FVar4),auVar33);
  auVar33 = vxorps_avx512vl(auVar35,auVar35);
  auVar33 = vfmadd213ss_avx512f(auVar33,ZEXT416((uint)FVar5),ZEXT416((uint)FVar6));
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar7),auVar31);
  auVar35 = vaddss_avx512f(ZEXT416((uint)FVar8),auVar33);
  auVar33 = vxorps_avx512vl(auVar37,auVar37);
  auVar33 = vfmadd213ss_avx512f(auVar33,ZEXT416((uint)FVar9),ZEXT416((uint)FVar10));
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar11),auVar31);
  auVar37 = vaddss_avx512f(ZEXT416((uint)fVar30),auVar33);
  auVar33 = vxorps_avx512vl(auVar34,auVar34);
  auVar33 = vfmadd213ss_avx512f(auVar33,ZEXT416((uint)FVar12),ZEXT416((uint)FVar13));
  auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar14),auVar31);
  vaddss_avx512f(ZEXT416((uint)FVar15),auVar33);
  auVar33 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar34 = vdivss_avx512f(auVar36,auVar33);
  auVar35 = vdivss_avx512f(auVar35,auVar33);
  auVar36 = vdivss_avx512f(auVar37,auVar33);
  auVar33 = vinsertps_avx512f(auVar34,auVar35,0x10);
  auVar33 = vsubps_avx512vl(auVar33,auVar32);
  auVar32 = vsubss_avx512f(auVar36,auVar38);
  uVar20 = vmovlps_avx512f(auVar33);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar20;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar32._0_4_;
  uVar21 = *(ulong *)(*(ulong *)(((this->super_ProjectiveCamera).super_CameraBase.film.
                                  super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                 0xffffffffffff) + 0x18) & 0xffffffffffff);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar21;
  auVar33 = vmovshdup_avx512vl(auVar39);
  auVar32 = vmulss_avx512f(ZEXT416((uint)FVar2),auVar33);
  auVar32 = vfnmsub231ss_avx512f(auVar32,auVar39,ZEXT416((uint)FVar1));
  vfmadd231ss_avx512f(auVar32,auVar31,ZEXT416((uint)FVar3));
  auVar32 = vmulss_avx512f(ZEXT416((uint)FVar6),auVar33);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar21;
  auVar32 = vfnmsub231ss_avx512f(auVar32,auVar41,ZEXT416((uint)FVar5));
  vfmadd231ss_avx512f(auVar32,auVar31,ZEXT416((uint)FVar7));
  auVar32 = vmulss_avx512f(ZEXT416((uint)FVar10),auVar33);
  auVar32 = vfnmsub231ss_avx512f(auVar32,auVar41,ZEXT416((uint)FVar9));
  auVar34 = vfmadd231ss_avx512f(auVar32,auVar31,ZEXT416((uint)FVar11));
  auVar33 = vmulss_avx512f(ZEXT416((uint)FVar13),auVar33);
  auVar33 = vfnmsub231ss_avx512f(auVar33,ZEXT416((uint)FVar12),auVar41);
  vfmadd231ss_avx512f(auVar33,auVar31,ZEXT416((uint)FVar14));
  auVar32 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar33 = vucomiss_avx512f(auVar31);
  auVar33 = vsqrtss_avx(auVar33,auVar33);
  this->cosTotalWidth = ((fVar30 + auVar34._0_4_) / auVar32._0_4_) / auVar33._0_4_;
  uVar21 = *(ulong *)((this->super_ProjectiveCamera).super_CameraBase.film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff);
  auVar36 = ZEXT416((uint)(float)(int)uVar21);
  bVar26 = uVar21 >> 0x20 == 0;
  bVar22 = (POPCOUNT(uVar21 >> 0x20 & 0xff) & 1U) != 0;
  fVar30 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1];
  auVar33 = vmulss_avx512f(ZEXT416((uint)fVar30),auVar31);
  auVar39 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0]);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar39,auVar31);
  auVar41 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2]);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar41,auVar31);
  fVar16 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  fVar44 = fVar16 + auVar33._0_4_;
  fVar43 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1];
  auVar33 = vmulss_avx512f(ZEXT416((uint)fVar43),auVar31);
  auVar42 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar42,auVar31);
  auVar45 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2]);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar45,auVar31);
  fVar17 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  fVar23 = fVar17 + auVar33._0_4_;
  fVar18 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1];
  auVar33 = vmulss_avx512f(ZEXT416((uint)fVar18),auVar31);
  auVar46 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0]);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar46,auVar31);
  auVar47 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2]);
  auVar32 = vfmadd231ss_avx512f(auVar33,auVar47,auVar31);
  fVar19 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar49 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1]);
  auVar33 = vmulss_avx512f(auVar49,auVar31);
  auVar48 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0]);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar48,auVar31);
  auVar50 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2]);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar50,auVar31);
  auVar51 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3]);
  vaddss_avx512f(auVar51,auVar33);
  auVar33 = vucomiss_avx512f(ZEXT416(0x3f800000));
  fVar24 = fVar19 + auVar32._0_4_;
  bVar27 = bVar26 && bVar22;
  bVar25 = !bVar22;
  auVar32 = vdivss_avx512f(ZEXT416((uint)fVar44),auVar33);
  auVar35._4_12_ = auVar32._4_12_;
  auVar35._0_4_ = (uint)bVar27 * (int)fVar44 + (uint)(!bVar26 || !bVar22) * auVar32._0_4_;
  auVar32 = vdivss_avx512f(ZEXT416((uint)fVar23),auVar33);
  auVar34 = vdivss_avx512f(ZEXT416((uint)fVar24),auVar33);
  auVar37._4_12_ = auVar32._4_12_;
  auVar37._0_4_ = (uint)bVar27 * (int)fVar23 + (uint)(!bVar26 || !bVar22) * auVar32._0_4_;
  auVar33 = vcvtsi2ss_avx512f(auVar40,(int)(uVar21 >> 0x20));
  auVar38._4_12_ = auVar34._4_12_;
  auVar38._0_4_ = (uint)bVar27 * (int)fVar24 + (uint)(!bVar26 || !bVar22) * auVar34._0_4_;
  fVar44 = auVar33._0_4_;
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar30)),auVar36,auVar39);
  auVar32 = vfmadd231ss_avx512f(auVar32,auVar31,auVar41);
  fVar16 = fVar16 + auVar32._0_4_;
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar43)),auVar36,auVar42);
  auVar32 = vfmadd231ss_avx512f(auVar32,auVar31,auVar45);
  fVar17 = fVar17 + auVar32._0_4_;
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar44)),auVar36,auVar46);
  auVar32 = vfmadd231ss_avx512f(auVar32,auVar31,auVar47);
  auVar33 = vmulss_avx512f(auVar49,auVar33);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar48,auVar36);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar50,auVar31);
  vaddss_avx512f(auVar51,auVar33);
  auVar33 = vucomiss_avx512f(ZEXT416(0x3f800000));
  fVar19 = fVar19 + auVar32._0_4_;
  bVar27 = (!bVar26 || bVar25) && bVar27;
  fVar43 = auVar33._0_4_;
  fVar30 = (float)((uint)bVar27 * (int)fVar19 +
                  (uint)(!bVar26 || (!bVar25 || !bVar22)) * (int)(fVar19 / fVar43));
  auVar32 = vdivss_avx512f(auVar35,auVar38);
  auVar31 = vdivss_avx512f(auVar37,auVar38);
  auVar33._8_4_ = 0x7fffffff;
  auVar33._0_8_ = 0x7fffffff7fffffff;
  auVar33._12_4_ = 0x7fffffff;
  auVar33 = vandps_avx512vl(ZEXT416((uint)(((float)((uint)bVar27 * (int)fVar16 +
                                                   (uint)(!bVar26 || (!bVar25 || !bVar22)) *
                                                   (int)(fVar16 / fVar43)) / fVar30 - auVar32._0_4_)
                                          * ((float)((uint)bVar27 * (int)fVar17 +
                                                    (uint)(!bVar26 || (!bVar25 || !bVar22)) *
                                                    (int)(fVar17 / fVar43)) / fVar30 - auVar31._0_4_
                                            ))),auVar33);
  this->A = auVar33._0_4_;
  local_400.
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           )((ulong)this | 0x1000000000000);
  CameraBase::FindMinimumDifferentials((CameraBase *)this,&local_400);
  return;
}

Assistant:

PerspectiveCamera(CameraBaseParameters baseParameters, Float fov,
                      const Bounds2f &screenWindow, Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Perspective(fov, 1e-2f, 1000.f), screenWindow,
                           lensRadius, focalDistance) {
        // Compute differential changes in origin for perspective camera rays
        dxCamera =
            cameraFromRaster(Point3f(1, 0, 0)) - cameraFromRaster(Point3f(0, 0, 0));
        dyCamera =
            cameraFromRaster(Point3f(0, 1, 0)) - cameraFromRaster(Point3f(0, 0, 0));

        // Compute _cosTotalWidth_ for perspective camera
        Point2f radius = Point2f(film.GetFilter().Radius());
        Point3f pCorner(-radius.x, -radius.y, 0.f);
        Vector3f wCornerCamera = Normalize(Vector3f(cameraFromRaster(pCorner)));
        cosTotalWidth = wCornerCamera.z;
        DCHECK_LT(.9999 * cosTotalWidth, std::cos(Radians(fov / 2)));

        // Compute image plane area at $z=1$ for _PerspectiveCamera_
        Point2i res = film.FullResolution();
        Point3f pMin = cameraFromRaster(Point3f(0, 0, 0));
        Point3f pMax = cameraFromRaster(Point3f(res.x, res.y, 0));
        pMin /= pMin.z;
        pMax /= pMax.z;
        A = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));

        // Compute minimum differentials for _PerspectiveCamera_
        FindMinimumDifferentials(this);
    }